

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O2

uint8_t * __thiscall jrtplib::RTCPSDESPacket::GetPRIVValueData(RTCPSDESPacket *this)

{
  byte bVar1;
  byte bVar2;
  uint8_t *puVar3;
  size_t sVar4;
  uint8_t *puVar5;
  
  if ((((this->super_RTCPPacket).knownformat == true) &&
      (puVar3 = this->currentchunk, puVar3 != (uint8_t *)0x0)) &&
     (sVar4 = this->itemoffset, puVar3[sVar4] == '\b')) {
    bVar1 = puVar3[sVar4 + 1];
    if (((ulong)bVar1 != 0) && (bVar2 = puVar3[sVar4 + 2], (uint)bVar2 <= bVar1 - 1)) {
      puVar5 = (uint8_t *)0x0;
      if ((ulong)bVar1 - 1 != (ulong)bVar2) {
        puVar5 = puVar3 + (ulong)bVar2 + sVar4 + 3;
      }
      return puVar5;
    }
  }
  return (uint8_t *)0x0;
}

Assistant:

inline uint8_t *RTCPSDESPacket::GetPRIVValueData()
{
	if (!knownformat)
		return 0;
	if (currentchunk == 0)
		return 0;
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+itemoffset);
	if (sdeshdr->sdesid != RTCP_SDES_ID_PRIVATE)
		return 0;
	if (sdeshdr->length == 0)
		return 0;
	uint8_t *preflen = currentchunk+itemoffset+sizeof(RTCPSDESHeader);
	size_t prefixlength = (size_t)(*preflen);
	if (prefixlength > (size_t)((sdeshdr->length)-1))
		return 0;
	size_t valuelen = ((size_t)(sdeshdr->length))-prefixlength-1;
	if (valuelen == 0)
		return 0;
	return (currentchunk+itemoffset+sizeof(RTCPSDESHeader)+1+prefixlength);
}